

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatWriter.cpp
# Opt level: O3

void __thiscall OpenMD::StatWriter::writePotVec(StatWriter *this,int i)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uint j;
  long lVar4;
  uint j_1;
  potVec s;
  string local_78;
  potVec local_58;
  
  Stats::getPotVecData(&local_58,this->stats_,i);
  lVar4 = 0;
  bVar3 = 0;
  do {
    bVar2 = bVar3;
    bVar1 = 0x7fefffffffffffff < (ulong)ABS(local_58.data_[lVar4]);
    lVar4 = lVar4 + 1;
    bVar3 = bVar2 | bVar1;
  } while (lVar4 != 7);
  if ((bool)(bVar2 | bVar1)) {
    Stats::getTitle_abi_cxx11_(&local_78,this->stats_,i);
    snprintf(painCave.errMsg,2000,"StatWriter detected a numerical error writing: %s",
             local_78._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    simError();
  }
  else {
    lVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\t",1);
      std::ostream::_M_insert<double>(local_58.data_[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 7);
  }
  return;
}

Assistant:

void StatWriter::writePotVec(int i) {
    potVec s = stats_->getPotVecData(i);

    bool foundError = false;

    for (unsigned int j = 0; j < N_INTERACTION_FAMILIES; j++) {
      if (std::isinf(s[j]) || std::isnan(s[j])) foundError = true;
    }
    if (foundError) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StatWriter detected a numerical error writing: %s",
               stats_->getTitle(i).c_str());
      painCave.isFatal = 1;
      simError();
    } else {
      for (unsigned int j = 0; j < N_INTERACTION_FAMILIES; j++) {
        statfile_ << "\t" << s[j];
      }
    }
  }